

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.h
# Opt level: O0

Value * __thiscall
soul::Value::castToTypeWithError<soul::CodeLocation&>
          (Value *__return_storage_ptr__,Value *this,Type *destType,CodeLocation *errorLocation)

{
  undefined8 this_00;
  bool bVar1;
  CompileMessage local_b0;
  undefined1 local_61;
  undefined1 local_60 [8];
  CompileMessage errorMessage;
  CodeLocation *errorLocation_local;
  Type *destType_local;
  Value *this_local;
  Value *result;
  
  errorMessage._48_8_ = errorLocation;
  CompileMessage::CompileMessage((CompileMessage *)local_60);
  local_61 = 0;
  tryCastToType(__return_storage_ptr__,this,destType,(CompileMessage *)local_60);
  bVar1 = isValid(__return_storage_ptr__);
  this_00 = errorMessage._48_8_;
  if (bVar1) {
    local_61 = 1;
    CompileMessage::~CompileMessage((CompileMessage *)local_60);
    return __return_storage_ptr__;
  }
  CompileMessage::CompileMessage(&local_b0,(CompileMessage *)local_60);
  CodeLocation::throwError((CodeLocation *)this_00,&local_b0);
}

Assistant:

Value castToTypeWithError (const Type& destType, Thrower&& errorLocation) const
    {
        CompileMessage errorMessage;
        auto result = tryCastToType (destType, errorMessage);

        if (! result.isValid())
            errorLocation.throwError (errorMessage);

        return result;
    }